

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__texenv
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__gles_texenv_mode_enums EVar2;
  ParserTemplateBase *this_00;
  StringHash attributeHash;
  ParserChar *buffer;
  long *in_RSI;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  texenv__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined7 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  SaxParser *baseConversionFunctionPtr;
  bool *failed_00;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL14::texenv__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  buffer = (ParserChar *)*in_RSI;
  if (buffer == (ParserChar *)0x0) {
LAB_0087b744:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          failed_00 = *(bool **)buffer;
          if (failed_00 == (bool *)0x0) goto LAB_0087b744;
          attributeHash = GeneratedSaxParser::Utils::calculateStringHash(failed_00);
          if (buffer + 8 == (ParserChar *)0x0) {
            return false;
          }
          baseConversionFunctionPtr = *(SaxParser **)(buffer + 8);
          buffer = buffer + 0x10;
          if (attributeHash != 0x7c504) break;
          (this_00->super_Parser).mSaxParser = baseConversionFunctionPtr;
        }
        if (attributeHash != 0x6c88e02) break;
        EVar2 = GeneratedSaxParser::Utils::
                toEnum<COLLADASaxFWL14::ENUM__gles_texenv_mode_enums,_unsigned_long,_(COLLADASaxFWL14::ENUM__gles_texenv_mode_enums)5>
                          (buffer,failed_00,
                           (pair<unsigned_long,_COLLADASaxFWL14::ENUM__gles_texenv_mode_enums> *)
                           0x6c88e02,
                           (_func_unsigned_long_ParserChar_ptr_bool_ptr *)baseConversionFunctionPtr)
        ;
        *(ENUM__gles_texenv_mode_enums *)&(this_00->super_Parser)._vptr_Parser = EVar2;
        if (((in_stack_ffffffffffffffaf & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                               (StringHash)failed_00,attributeHash,
                               (ParserChar *)baseConversionFunctionPtr), bVar1)) {
          return false;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__texenv( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__texenv( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

texenv__AttributeData* attributeData = newData<texenv__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_operator:
    {
bool failed;
attributeData->_operator = Utils::toEnum<ENUM__gles_texenv_mode_enums, StringHash, ENUM__gles_texenv_mode_enums__COUNT>(attributeValue, failed, ENUM__gles_texenv_mode_enumsMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXENV,
        HASH_ATTRIBUTE_operator,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_unit:
    {

attributeData->unit = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->unit, strlen(attributeData->unit));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXENV,
            HASH_ATTRIBUTE_unit,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TEXENV, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}